

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

Reference<std::allocator<absl::status_internal::Payload>_> __thiscall
absl::inlined_vector_internal::
Storage<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>::
EmplaceBack<absl::status_internal::Payload>
          (Storage<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
           *this,Payload *args)

{
  ulong uVar1;
  Pointer<std::allocator<absl::status_internal::Payload>_> pPVar2;
  Reference<std::allocator<absl::status_internal::Payload>_> pVVar3;
  ulong uVar4;
  
  uVar1 = (this->metadata_).
          super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if ((uVar1 & 1) == 0) {
    uVar4 = 1;
  }
  else {
    uVar4 = (this->data_).allocated.allocated_capacity;
  }
  if (uVar1 >> 1 != uVar4) {
    if ((uVar1 & 1) == 0) {
      pPVar2 = (Pointer<std::allocator<absl::status_internal::Payload>_>)&this->data_;
    }
    else {
      pPVar2 = (this->data_).allocated.allocated_data;
    }
    status_internal::Payload::Payload(pPVar2 + (uVar1 >> 1),args);
    (this->metadata_).
    super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value =
         (this->metadata_).
         super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
         .super_Storage<unsigned_long,_1UL,_false>.value + 2;
    return pPVar2 + (uVar1 >> 1);
  }
  pVVar3 = EmplaceBackSlow<absl::status_internal::Payload>(this,args);
  return pVVar3;
}

Assistant:

auto Storage<T, N, A>::EmplaceBack(Args&&... args) -> Reference<A> {
  StorageView<A> storage_view = MakeStorageView();
  const SizeType<A> n = storage_view.size;
  if (ABSL_PREDICT_TRUE(n != storage_view.capacity)) {
    // Fast path; new element fits.
    Pointer<A> last_ptr = storage_view.data + n;
    AllocatorTraits<A>::construct(GetAllocator(), last_ptr,
                                  std::forward<Args>(args)...);
    AddSize(1);
    return *last_ptr;
  }
  // TODO(b/173712035): Annotate with musttail attribute to prevent regression.
  return EmplaceBackSlow(std::forward<Args>(args)...);
}